

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void pybind11::detail::all_type_info_add_base_most_derived_first
               (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                *bases,type_info *addl_base)

{
  bool bVar1;
  int iVar2;
  reference pptVar3;
  const_iterator local_38;
  type_info *local_30;
  type_info *existing_base;
  __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
  local_20;
  iterator it;
  type_info *addl_base_local;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *bases_local
  ;
  
  it._M_current = (type_info **)addl_base;
  local_20._M_current =
       (type_info **)
       std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
       begin(bases);
  while( true ) {
    existing_base =
         (type_info *)
         std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
         ::end(bases);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                        *)&existing_base);
    if (!bVar1) {
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      push_back(bases,(value_type *)&it);
      return;
    }
    pptVar3 = __gnu_cxx::
              __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
              ::operator*(&local_20);
    local_30 = *pptVar3;
    iVar2 = PyType_IsSubtype(*it._M_current);
    if (iVar2 != 0) break;
    __gnu_cxx::
    __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
    ::operator++(&local_20,0);
  }
  __gnu_cxx::
  __normal_iterator<pybind11::detail::type_info*const*,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>
  ::__normal_iterator<pybind11::detail::type_info**>
            ((__normal_iterator<pybind11::detail::type_info*const*,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>
              *)&local_38,&local_20);
  std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::insert
            (bases,local_38,(value_type *)&it);
  return;
}

Assistant:

inline void all_type_info_add_base_most_derived_first(std::vector<type_info *> &bases,
                                                      type_info *addl_base) {
    for (auto it = bases.begin(); it != bases.end(); it++) {
        type_info *existing_base = *it;
        if (PyType_IsSubtype(addl_base->type, existing_base->type) != 0) {
            bases.insert(it, addl_base);
            return;
        }
    }
    bases.push_back(addl_base);
}